

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

void __thiscall
QNetworkHeadersPrivate::parseAndSetHeader
          (QNetworkHeadersPrivate *this,QByteArrayView key,QByteArrayView value)

{
  long lVar1;
  QByteArrayView value_00;
  int iVar2;
  undefined8 in_RCX;
  KnownHeaders key_00;
  storage_type *in_RSI;
  QNetworkHeadersPrivate *in_R8;
  long in_FS_OFFSET;
  KnownHeaders parsedKey;
  int parsedKeyAsInt;
  undefined1 in_stack_00000090 [16];
  
  key_00 = (KnownHeaders)((ulong)in_RCX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = parseHeaderName((QByteArrayView)in_stack_00000090);
  if (iVar2 != -1) {
    value_00.m_data = in_RSI;
    value_00.m_size = (qsizetype)in_R8;
    parseAndSetHeader(in_R8,key_00,value_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkHeadersPrivate::parseAndSetHeader(QByteArrayView key, QByteArrayView value)
{
    // is it a known header?
    const int parsedKeyAsInt = parseHeaderName(key);
    if (parsedKeyAsInt != -1) {
        const QNetworkRequest::KnownHeaders parsedKey
                = static_cast<QNetworkRequest::KnownHeaders>(parsedKeyAsInt);
        parseAndSetHeader(parsedKey, value);
    }
}